

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MacProj.cpp
# Opt level: O2

void __thiscall MacProj::check_div_cond(MacProj *this,int level,MultiFab *U_edge)

{
  long lVar1;
  unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_> uVar2;
  int i;
  long lVar3;
  long lVar4;
  long lVar5;
  ostream *os_;
  int j;
  long lVar6;
  long lVar7;
  double *pdVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  double *pdVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  double *pdVar20;
  double dVar21;
  double local_6d8;
  long local_6d0;
  long local_6c8;
  long local_6c0;
  long local_6b8;
  long local_6b0;
  long local_6a8;
  long local_690;
  long local_688;
  long local_680;
  long local_678;
  Box local_554;
  Array4<double> local_538;
  Array4<double> local_4f8;
  Array4<double> local_4b8;
  Array4<const_double> local_478;
  Array4<const_double> local_438;
  Array4<const_double> local_3f8;
  Array4<const_double> local_3b8;
  Array4<double> local_378;
  MFIter mfi;
  MultiFab dmac;
  
  uVar2._M_t.super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>._M_t.
  super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>.
  super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl =
       (this->parent->amr_level).
       super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
       .
       super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start[level]._M_t;
  mfi.m_fa._M_t.
  super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
  super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
  super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
       (__uniq_ptr_data<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>,_true,_true>)
       (__uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>)0x1;
  mfi.fabArray = (FabArrayBase *)0x0;
  mfi.tile_size.vect[0] = 0;
  mfi.tile_size.vect[1] = 0;
  mfi.tile_size.vect[2] = 0;
  mfi.flags = '\0';
  mfi._29_3_ = 0;
  mfi.currentIndex = 0;
  mfi.beginIndex = 0;
  local_538.p = (double *)&PTR__FabFactory_007d2928;
  amrex::MultiFab::MultiFab
            (&dmac,(BoxArray *)
                   ((long)uVar2._M_t.
                          super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                          .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl + 0x3c8),
             (DistributionMapping *)
             ((long)uVar2._M_t.
                    super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>.
                    _M_t.
                    super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                    .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl + 0x430),1,0,
             (MFInfo *)&mfi,(FabFactory<amrex::FArrayBox> *)&local_538);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&mfi.tile_size);
  amrex::MFIter::MFIter(&mfi,(FabArrayBase *)&dmac,true);
  while( true ) {
    if (mfi.endIndex <= mfi.currentIndex) break;
    amrex::MFIter::tilebox(&local_554,&mfi);
    amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              (&local_538,&dmac.super_FabArray<amrex::FArrayBox>,&mfi);
    amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              (&local_4f8,&U_edge->super_FabArray<amrex::FArrayBox>,&mfi);
    amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              (&local_4b8,&U_edge[1].super_FabArray<amrex::FArrayBox>,&mfi);
    amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              (&local_378,&U_edge[2].super_FabArray<amrex::FArrayBox>,&mfi);
    amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              (&local_3b8,
               (FabArray<amrex::FArrayBox> *)
               ((long)uVar2._M_t.
                      super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>.
                      _M_t.
                      super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                      .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl + 0x540),&mfi);
    amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              (&local_3f8,
               (FabArray<amrex::FArrayBox> *)
               ((long)uVar2._M_t.
                      super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>.
                      _M_t.
                      super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                      .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl + 0x6c0),&mfi);
    amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              (&local_438,
               (FabArray<amrex::FArrayBox> *)
               ((long)uVar2._M_t.
                      super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>.
                      _M_t.
                      super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                      .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl + 0x840),&mfi);
    amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              (&local_478,
               (FabArray<amrex::FArrayBox> *)
               ((long)uVar2._M_t.
                      super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>.
                      _M_t.
                      super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                      .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl + 0x3c0),&mfi);
    lVar16 = (long)local_554.smallend.vect[0];
    lVar7 = (long)local_554.smallend.vect[2];
    lVar18 = local_378.kstride * 8;
    local_678 = (lVar7 - local_378.begin.z) * lVar18 + lVar16 * 8 + (long)local_378.begin.x * -8 +
                (long)local_378.p;
    local_680 = ((lVar7 + 1) - (long)local_378.begin.z) * lVar18 + lVar16 * 8 +
                (long)local_378.begin.x * -8 + (long)local_378.p;
    lVar9 = local_438.kstride * 8;
    local_688 = (lVar7 - local_438.begin.z) * lVar9 + lVar16 * 8 + (long)local_438.begin.x * -8 +
                (long)local_438.p;
    local_690 = ((lVar7 + 1) - (long)local_438.begin.z) * lVar9 + lVar16 * 8 +
                (long)local_438.begin.x * -8 + (long)local_438.p;
    lVar3 = CONCAT44(local_4f8.kstride._4_4_,(int)local_4f8.kstride) * 8;
    local_6c8 = (lVar7 - local_4f8.begin.z) * lVar3 + lVar16 * 8 + (long)local_4f8.begin.x * -8 +
                CONCAT44(local_4f8.p._4_4_,(int)local_4f8.p) + 8;
    local_6a8 = (lVar7 - local_478.begin.z) * local_478.kstride * 8 + lVar16 * 8 +
                (long)local_478.begin.x * -8 + (long)local_478.p;
    local_6b0 = (lVar7 - local_538.begin.z) * local_538.kstride * 8 + lVar16 * 8 +
                (long)local_538.begin.x * -8 + (long)local_538.p;
    local_6b8 = (lVar7 - local_4b8.begin.z) * local_4b8.kstride * 8 + lVar16 * 8 +
                (long)local_4b8.begin.x * -8 + (long)local_4b8.p;
    local_6c0 = (lVar7 - local_3f8.begin.z) * local_3f8.kstride * 8 + lVar16 * 8 +
                (long)local_3f8.begin.x * -8 + (long)local_3f8.p;
    lVar4 = CONCAT44(local_4b8.jstride._4_4_,(undefined4)local_4b8.jstride) * 8;
    local_6d0 = (lVar7 - local_3b8.begin.z) * local_3b8.kstride * 8 + lVar16 * 8 +
                (long)local_3b8.begin.x * -8 + (long)local_3b8.p;
    while (lVar7 <= local_554.bigend.vect[2]) {
      lVar7 = lVar7 + 1;
      lVar16 = (long)local_554.smallend.vect[1];
      while (lVar16 <= local_554.bigend.vect[1]) {
        if (local_554.bigend.vect[0] < local_554.smallend.vect[0]) {
          lVar16 = lVar16 + 1;
        }
        else {
          lVar1 = lVar16 + 1;
          lVar17 = lVar16 - local_3f8.begin.y;
          lVar5 = lVar16 - local_4b8.begin.y;
          lVar10 = (lVar16 - local_438.begin.y) * local_438.jstride * 8;
          lVar11 = (lVar16 - local_378.begin.y) * local_378.jstride * 8;
          lVar14 = lVar16 - local_478.begin.y;
          lVar13 = (lVar16 - local_538.begin.y) * local_538.jstride * 8 + local_6b0;
          lVar12 = (lVar16 - local_4f8.begin.y) *
                   CONCAT44(local_4f8.jstride._4_4_,(int)local_4f8.jstride) * 8 + local_6c8;
          lVar6 = (lVar16 - local_3b8.begin.y) * local_3b8.jstride * 8 + local_6d0;
          lVar19 = 0;
          do {
            dVar21 = (*(double *)(lVar10 + local_690 + lVar19 * 8) *
                      *(double *)(lVar11 + local_680 + lVar19 * 8) +
                     ((*(double *)
                        ((lVar1 - local_3f8.begin.y) * local_3f8.jstride * 8 + local_6c0 +
                        lVar19 * 8) *
                       *(double *)((lVar1 - local_4b8.begin.y) * lVar4 + local_6b8 + lVar19 * 8) +
                      (*(double *)(lVar6 + 8 + lVar19 * 8) * *(double *)(lVar12 + lVar19 * 8) -
                      *(double *)(lVar12 + -8 + lVar19 * 8) * *(double *)(lVar6 + lVar19 * 8))) -
                     *(double *)(lVar17 * local_3f8.jstride * 8 + local_6c0 + lVar19 * 8) *
                     *(double *)(lVar5 * lVar4 + local_6b8 + lVar19 * 8))) -
                     *(double *)(local_688 + lVar10 + lVar19 * 8) *
                     *(double *)(local_678 + lVar11 + lVar19 * 8);
            *(double *)(lVar13 + lVar19 * 8) = dVar21;
            *(double *)(lVar13 + lVar19 * 8) =
                 dVar21 / *(double *)(lVar14 * local_478.jstride * 8 + local_6a8 + lVar19 * 8);
            lVar19 = lVar19 + 1;
            lVar16 = lVar1;
          } while ((local_554.bigend.vect[0] - local_554.smallend.vect[0]) + 1 != (int)lVar19);
        }
      }
      local_6a8 = local_6a8 + local_478.kstride * 8;
      local_6b0 = local_6b0 + local_538.kstride * 8;
      local_678 = local_678 + lVar18;
      local_680 = local_680 + lVar18;
      local_688 = local_688 + lVar9;
      local_690 = local_690 + lVar9;
      local_6b8 = local_6b8 + local_4b8.kstride * 8;
      local_6c0 = local_6c0 + local_3f8.kstride * 8;
      local_6c8 = local_6c8 + lVar3;
      local_6d0 = local_6d0 + local_3b8.kstride * 8;
    }
    amrex::MFIter::operator++(&mfi);
  }
  amrex::MFIter::~MFIter(&mfi);
  local_4b8.p = (double *)0x0;
  local_4b8.jstride._0_4_ = 0;
  amrex::MFIter::MFIter(&mfi,(FabArrayBase *)&dmac,true);
  local_6d8 = 0.0;
  while (mfi.currentIndex < mfi.endIndex) {
    amrex::MFIter::growntilebox((Box *)&local_4f8,&mfi,(IntVect *)&local_4b8);
    amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
              ((Array4<const_double> *)&local_538,&dmac.super_FabArray<amrex::FArrayBox>,&mfi);
    lVar3 = (long)(int)local_4f8.jstride;
    pdVar20 = (double *)
              ((lVar3 - local_538.begin.z) * local_538.kstride * 8 +
               ((long)local_4f8.p._4_4_ - (long)local_538.begin.y) * local_538.jstride * 8 +
               (long)(int)local_4f8.p * 8 + (long)local_538.begin.x * -8 + (long)local_538.p);
    dVar21 = 0.0;
    for (; lVar4 = (long)local_4f8.p._4_4_, pdVar15 = pdVar20, lVar3 <= local_4f8.kstride._4_4_;
        lVar3 = lVar3 + 1) {
      for (; lVar7 = (long)(int)local_4f8.p, pdVar8 = pdVar15, lVar4 <= (int)local_4f8.kstride;
          lVar4 = lVar4 + 1) {
        for (; lVar7 <= local_4f8.jstride._4_4_; lVar7 = lVar7 + 1) {
          dVar21 = dVar21 + *pdVar8;
          pdVar8 = pdVar8 + 1;
        }
        pdVar15 = pdVar15 + local_538.jstride;
      }
      pdVar20 = pdVar20 + local_538.kstride;
    }
    local_6d8 = local_6d8 + dVar21;
    amrex::MFIter::operator++(&mfi);
  }
  amrex::MFIter::~MFIter(&mfi);
  if (verbose != 0) {
    os_ = amrex::OutStream();
    amrex::Print::Print((Print *)&mfi,os_);
    *(undefined8 *)((long)mfi.tile_size.vect + *(long *)(mfi.tile_size.vect._0_8_ + -0x18) + 8) =
         0xf;
    std::operator<<((ostream *)&mfi.tile_size,"SUM of DIV(U_edge) = ");
    std::ostream::_M_insert<double>(local_6d8);
    std::operator<<((ostream *)&mfi.tile_size,'\n');
    amrex::Print::~Print((Print *)&mfi);
  }
  amrex::MultiFab::~MultiFab(&dmac);
  return;
}

Assistant:

void
MacProj::check_div_cond (int      level,
                         MultiFab U_edge[]) const
{
    const NavierStokesBase& ns_level = *(NavierStokesBase*) &(parent->getLevel(level));
    const MultiFab& volume       = ns_level.Volume();
    const MultiFab* area         = ns_level.Area();

    MultiFab dmac(volume.boxArray(),volume.DistributionMap(),1,0);

#ifdef _OPENMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(dmac,TilingIfNotGPU());mfi.isValid();++mfi)
    {
        const Box& bx = mfi.tilebox();
        auto const& cc_divu   = dmac.array(mfi);
        D_TERM(auto const& ux_e = U_edge[0].array(mfi);,
               auto const& uy_e = U_edge[1].array(mfi);,
               auto const& uz_e = U_edge[2].array(mfi););
        D_TERM(auto const& xarea  = area[0].array(mfi);,
               auto const& yarea  = area[1].array(mfi);,
               auto const& zarea  = area[2].array(mfi););
        auto const& vol       = volume.array(mfi);

        amrex::ParallelFor(bx, [cc_divu,D_DECL(ux_e,uy_e,uz_e),
                                        D_DECL(xarea,yarea,zarea), vol]
        AMREX_GPU_DEVICE (int i, int j, int k) noexcept
        {
            cc_divu(i,j,k) = D_TERM(  xarea(i+1,j,k)*ux_e(i+1,j,k) - xarea(i,j,k)*ux_e(i,j,k),
                                    + yarea(i,j+1,k)*uy_e(i,j+1,k) - yarea(i,j,k)*uy_e(i,j,k),
                                    + zarea(i,j,k+1)*uz_e(i,j,k+1) - zarea(i,j,k)*uz_e(i,j,k));
            cc_divu(i,j,k) /= vol(i,j,k);
        });
    }

    Real sm = amrex::ReduceSum(dmac, 0, []
    AMREX_GPU_HOST_DEVICE (Box const& bx, Array4<Real const> const& dmac_arr) -> Real
    {
        Real tmp = 0.0;
        AMREX_LOOP_3D(bx, i, j, k,
        {
            tmp += dmac_arr(i,j,k);
        });
        return tmp;
    });

    if (verbose)
    {
        const int IOProc = ParallelDescriptor::IOProcessorNumber();

        ParallelDescriptor::ReduceRealSum(sm,IOProc);

        amrex::Print().SetPrecision(15) << "SUM of DIV(U_edge) = " << sm << '\n';
    }
}